

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

uint8_t bcm2835_spi_transfer(uint8_t value)

{
  uint32_t *paddr_00;
  byte bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t *paddr_01;
  uint32_t ret;
  uint32_t *fifo;
  uint32_t *paddr;
  uint8_t value_local;
  
  paddr_00 = bcm2835_spi0;
  paddr_01 = bcm2835_spi0 + 1;
  bcm2835_peri_set_bits(bcm2835_spi0,0x30,0x30);
  bcm2835_peri_set_bits(paddr_00,0x80,0x80);
  do {
    uVar3 = bcm2835_peri_read(paddr_00);
  } while ((uVar3 & 0x40000) == 0);
  bVar1 = bcm2835_correct_order(value);
  bcm2835_peri_write_nb(paddr_01,(uint)bVar1);
  do {
    uVar3 = bcm2835_peri_read_nb(paddr_00);
  } while ((uVar3 & 0x10000) == 0);
  uVar3 = bcm2835_peri_read_nb(paddr_01);
  uVar2 = bcm2835_correct_order((uint8_t)uVar3);
  bcm2835_peri_set_bits(paddr_00,0,0x80);
  return uVar2;
}

Assistant:

uint8_t bcm2835_spi_transfer(uint8_t value)
{
    volatile uint32_t* paddr = bcm2835_spi0 + BCM2835_SPI0_CS/4;
    volatile uint32_t* fifo = bcm2835_spi0 + BCM2835_SPI0_FIFO/4;
    uint32_t ret;

    /* This is Polled transfer as per section 10.6.1
    // BUG ALERT: what happens if we get interupted in this section, and someone else
    // accesses a different peripheral? 
    // Clear TX and RX fifos
    */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_CLEAR, BCM2835_SPI0_CS_CLEAR);

    /* Set TA = 1 */
    bcm2835_peri_set_bits(paddr, BCM2835_SPI0_CS_TA, BCM2835_SPI0_CS_TA);

    /* Maybe wait for TXD */
    while (!(bcm2835_peri_read(paddr) & BCM2835_SPI0_CS_TXD))
	;

    /* Write to FIFO, no barrier */
    bcm2835_peri_write_nb(fifo, bcm2835_correct_order(value));

    /* Wait for DONE to be set */
    while (!(bcm2835_peri_read_nb(paddr) & BCM2835_SPI0_CS_DONE))
	;

    /* Read any byte that was sent back by the slave while we sere sending to it */
    ret = bcm2835_correct_order(bcm2835_peri_read_nb(fifo));

    /* Set TA = 0, and also set the barrier */
    bcm2835_peri_set_bits(paddr, 0, BCM2835_SPI0_CS_TA);

    return ret;
}